

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O0

string * __thiscall
spvtools::FriendlyNameMapper::Sanitize
          (string *__return_storage_ptr__,FriendlyNameMapper *this,string *suggested_name)

{
  ulong uVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  allocator<char> local_49;
  string local_48 [8];
  string valid;
  string *suggested_name_local;
  FriendlyNameMapper *this_local;
  string *result;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    valid.field_2._M_local_buf[0xe] = '\0';
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_48,"abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ_0123456789",&local_49)
    ;
    std::allocator<char>::~allocator(&local_49);
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    __result = std::back_inserter<std::__cxx11::string>(__return_storage_ptr__);
    std::
    transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>,spvtools::FriendlyNameMapper::Sanitize(std::__cxx11::string_const&)::__0>
              (__first,__last,__result,(string *)local_48);
    valid.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::~string(local_48);
    if ((valid.field_2._M_local_buf[0xe] & 1U) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"_",
               (allocator<char> *)(valid.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(valid.field_2._M_local_buf + 0xf));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FriendlyNameMapper::Sanitize(const std::string& suggested_name) {
  if (suggested_name.empty()) return "_";
  // Otherwise, replace invalid characters by '_'.
  std::string result;
  std::string valid =
      "abcdefghijklmnopqrstuvwxyz"
      "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
      "_0123456789";
  std::transform(suggested_name.begin(), suggested_name.end(),
                 std::back_inserter(result), [&valid](const char c) {
                   return (std::string::npos == valid.find(c)) ? '_' : c;
                 });
  return result;
}